

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_SubDHash::SubDHash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDHash *this)

{
  undefined1 local_90 [8];
  ON_SHA1 sha1;
  ON_SubDHash *this_local;
  
  sha1.m_sha1_hash.m_digest._12_8_ = this;
  ON_SHA1::ON_SHA1((ON_SHA1 *)local_90);
  if (this->m_vertex_count != 0) {
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)local_90,this->m_vertex_count);
  }
  if (this->m_edge_count != 0) {
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)local_90,this->m_edge_count);
  }
  if (this->m_face_count != 0) {
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)local_90,this->m_face_count);
  }
  if (this->m_hash_type != Unset) {
    if (this->m_vertex_count != 0) {
      ON_SHA1::AccumulateSubHash((ON_SHA1 *)local_90,&this->m_vertex_hash);
    }
    if (this->m_edge_count != 0) {
      ON_SHA1::AccumulateSubHash((ON_SHA1 *)local_90,&this->m_edge_hash);
    }
    if (this->m_face_count != 0) {
      ON_SHA1::AccumulateSubHash((ON_SHA1 *)local_90,&this->m_face_hash);
    }
  }
  ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)local_90);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDHash::SubDHash() const
{
  ON_SHA1 sha1;
  if (m_vertex_count > 0)
    sha1.AccumulateInteger32(m_vertex_count);
  if (m_edge_count > 0)
    sha1.AccumulateInteger32(m_edge_count);
  if (m_face_count > 0)
    sha1.AccumulateInteger32(m_face_count);
  if (ON_SubDHashType::Unset != m_hash_type)
  {
    if (m_vertex_count > 0)
      sha1.AccumulateSubHash(m_vertex_hash);
    if (m_edge_count > 0)
      sha1.AccumulateSubHash(m_edge_hash);
    if (m_face_count > 0)
      sha1.AccumulateSubHash(m_face_hash);
  }
  return sha1.Hash();
}